

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_light.cpp
# Opt level: O2

void * QuadLight_create(void)

{
  undefined4 *super;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  super = (undefined4 *)embree::alignedUSMMalloc(0x70,0x10,DEVICE_READ_ONLY);
  *super = 6;
  local_18._0_8_ = 0;
  local_18._8_8_ = 0;
  local_28._0_8_ = 0x3f800000;
  local_28._8_8_ = 0;
  local_38._0_8_ = 0x3f80000000000000;
  local_38._8_8_ = 0;
  local_48._0_8_ = 0x3f8000003f800000;
  local_48._8_8_ = 0x3f8000003f800000;
  QuadLight_set(super,(Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,
                (Vec3fa *)&local_38.field_1,(Vec3fa *)&local_48.field_1);
  return super;
}

Assistant:

void* QuadLight_create()
{
  QuadLight* self = (QuadLight*) alignedUSMMalloc(sizeof(QuadLight),16);

  Light_Constructor(&self->super);
  //self->super.sample = GET_FUNCTION_POINTER(QuadLight_sample);
  self->super.type = LIGHT_QUAD;

  QuadLight_set(self,
                Vec3fa(0.f),
                Vec3fa(1.f, 0.f, 0.f),
                Vec3fa(0.f, 1.f, 0.f),
                Vec3fa(1.f));

  return self;
}